

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O0

DataType csv::internals::_determine_integral_type(longdouble *number)

{
  longdouble *number_local;
  
  if ((longdouble)0 <= *number) {
    if ((longdouble)127.0 < *number) {
      if ((longdouble)32767.0 < *number) {
        if ((longdouble)2147483647.0 < *number) {
          if (_DAT_0012e490 < *number) {
            number_local._4_4_ = CSV_BIGINT;
          }
          else {
            number_local._4_4_ = CSV_INT64;
          }
        }
        else {
          number_local._4_4_ = CSV_INT32;
        }
      }
      else {
        number_local._4_4_ = CSV_INT16;
      }
    }
    else {
      number_local._4_4_ = CSV_INT8;
    }
    return number_local._4_4_;
  }
  __assert_fail("number >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/vincentlaucsb[P]csv-parser/include/internal/data_type.hpp"
                ,0xd6,"DataType csv::internals::_determine_integral_type(const long double &)");
}

Assistant:

HEDLEY_PRIVATE HEDLEY_PURE CONSTEXPR_14
        DataType _determine_integral_type(const long double& number) noexcept {
            // We can assume number is always non-negative
            assert(number >= 0);

            if (number <= internals::CSV_INT8_MAX)
                return DataType::CSV_INT8;
            else if (number <= internals::CSV_INT16_MAX)
                return DataType::CSV_INT16;
            else if (number <= internals::CSV_INT32_MAX)
                return DataType::CSV_INT32;
            else if (number <= internals::CSV_INT64_MAX)
                return DataType::CSV_INT64;
            else // Conversion to long long will cause an overflow
                return DataType::CSV_BIGINT;
        }